

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

IDiagObjectAddress * __thiscall
Js::LocalsWalker::FindPropertyAddress
          (LocalsWalker *this,PropertyId propId,bool enumerateGroups,bool *isConst)

{
  bool bVar1;
  BOOL BVar2;
  int iVar3;
  undefined4 extraout_var;
  Type *ppVVar4;
  undefined4 extraout_var_00;
  IDiagObjectAddress *address;
  VariableWalkerBase *pVarWalker;
  undefined1 local_68 [4];
  int i;
  ResolvedObject resolveObject;
  bool *isConst_local;
  bool enumerateGroups_local;
  PropertyId propId_local;
  LocalsWalker *this_local;
  
  *isConst = false;
  resolveObject._56_8_ = isConst;
  if ((propId == 0x1cf) && ((this->hasUserNotDefinedArguments & 1U) != 0)) {
    ResolvedObject::ResolvedObject((ResolvedObject *)local_68);
    resolveObject.propId = (*this->pFrame->_vptr_DiagStackFrame[10])();
    resolveObject._4_4_ = extraout_var;
    BVar2 = CreateArgumentsObject(this,(ResolvedObject *)local_68);
    if (BVar2 != 0) {
      return (IDiagObjectAddress *)resolveObject.scriptContext;
    }
  }
  if (this->pVarWalkers !=
      (List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    for (pVarWalker._4_4_ = 0;
        iVar3 = JsUtil::
                ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>::
                Count(&this->pVarWalkers->
                       super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                     ), pVarWalker._4_4_ < iVar3; pVarWalker._4_4_ = pVarWalker._4_4_ + 1) {
      ppVVar4 = JsUtil::
                List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->pVarWalkers,pVarWalker._4_4_);
      if ((enumerateGroups) ||
         (bVar1 = VariableWalkerBase::IsWalkerForCurrentFrame(*ppVVar4), bVar1)) {
        ppVVar4 = JsUtil::
                  List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this->pVarWalkers,pVarWalker._4_4_);
        iVar3 = (*((*ppVVar4)->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[3]
                )(*ppVVar4,(ulong)(uint)propId,resolveObject._56_8_);
        if ((IDiagObjectAddress *)CONCAT44(extraout_var_00,iVar3) != (IDiagObjectAddress *)0x0) {
          return (IDiagObjectAddress *)CONCAT44(extraout_var_00,iVar3);
        }
      }
    }
  }
  return (IDiagObjectAddress *)0x0;
}

Assistant:

IDiagObjectAddress * LocalsWalker::FindPropertyAddress(PropertyId propId, bool enumerateGroups, bool& isConst)
    {
        isConst = false;
        if (propId == PropertyIds::arguments && hasUserNotDefinedArguments)
        {
            ResolvedObject resolveObject;
            resolveObject.scriptContext = pFrame->GetScriptContext();
            if (CreateArgumentsObject(&resolveObject))
            {
                return resolveObject.address;
            }
        }

        if (pVarWalkers)
        {
            for (int i = 0; i < pVarWalkers->Count(); i++)
            {
                VariableWalkerBase *pVarWalker = pVarWalkers->Item(i);
                if (!enumerateGroups && !pVarWalker->IsWalkerForCurrentFrame())
                {
                    continue;
                }

                IDiagObjectAddress *address = pVarWalkers->Item(i)->FindPropertyAddress(propId, isConst);
                if (address != nullptr)
                {
                    return address;
                }
            }
        }

        return nullptr;
    }